

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O1

string * __thiscall
LTAircraft::RelativePositionText_abi_cxx11_(string *__return_storage_ptr__,LTAircraft *this)

{
  positionTy *outApPos;
  bool bVar1;
  size_t sVar2;
  float fVar3;
  char out [100];
  vectorTy vecRel;
  string local_d8;
  string local_b8 [3];
  vectorTy local_48;
  
  outApPos = &this->nearestAirportPos;
  if (!NAN((this->nearestAirportPos)._lat)) {
    fVar3 = DataRefs::GetMiscNetwTime(&dataRefs);
    bVar1 = CheckEverySoOften(&this->lastNearestAirportCheck,180.0,fVar3);
    if (!bVar1) goto LAB_00155205;
  }
  fVar3 = DataRefs::GetMiscNetwTime(&dataRefs);
  this->lastNearestAirportCheck = fVar3;
  (this->nearestAirportPos)._lat = NAN;
  (this->nearestAirportPos)._lon = NAN;
  GetNearestAirportId_abi_cxx11_(local_b8,&this->ppos,outApPos);
  std::__cxx11::string::operator=((string *)&this->nearestAirport,(string *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
    operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1);
  }
  if (NAN(outApPos->_lat)) {
    positionTy::operator_cast_to_string(__return_storage_ptr__,&this->ppos);
    return __return_storage_ptr__;
  }
LAB_00155205:
  CoordVectorBetween(&local_48,outApPos,&this->ppos);
  HeadingText_abi_cxx11_(&local_d8,local_48.angle);
  snprintf((char *)local_b8,100,"%.1fnm %s of %s",SUB84(local_48.dist / 1852.0,0),
           local_d8._M_dataplus._M_p,(this->nearestAirport)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen((char *)local_b8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_b8,(long)&local_b8[0]._M_dataplus._M_p + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string LTAircraft::RelativePositionText ()
{
    // find/update the nearest airport when needed or
    if (std::isnan(nearestAirportPos.lat()) ||
        CheckEverySoOften(lastNearestAirportCheck, ACI_NEAR_AIRPRT_PERIOD))
    {
        lastNearestAirportCheck = dataRefs.GetMiscNetwTime();
    
        // Find the nearest airport
        nearestAirportPos.lat() = NAN;
        nearestAirportPos.lon() = NAN;
        nearestAirport = GetNearestAirportId(GetPPos(), &nearestAirportPos);
        if (std::isnan(nearestAirportPos.lat())) {   // no airport found?
            return std::string(GetPPos());
        }
    }
    
    // determine bearing from airport to position
    vectorTy vecRel = nearestAirportPos.between(GetPPos());
    
    // put together a nice string
    char out[100];
    snprintf(out, sizeof(out), "%.1fnm %s of %s",
             vecRel.dist / M_per_NM, HeadingText(vecRel.angle).c_str(), nearestAirport.c_str());
    return std::string(out);
}